

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O1

int fetch_all_stop_times_db(feed_db_t *db,stop_time_t **records)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  stop_time_t *psVar4;
  uchar *puVar5;
  long lVar6;
  sqlite3_stmt *stmt;
  stop_time_t record;
  char qr [160];
  sqlite3_stmt *local_1d0;
  stop_time_t local_1c8;
  char local_d8 [168];
  
  uVar2 = count_rows_db(db,"stop_times");
  if (0 < (int)uVar2) {
    memcpy(local_d8,
           "SELECT trip_id, arrival_time, departure_time,stop_id, stop_sequence, stop_headsign,pickup_type, drop_off_type,shape_dist_traveled, timepoint FROM `stop_times`;"
           ,0xa0);
    sqlite3_prepare_v2(db->conn,local_d8,-1,&local_1d0,(char **)0x0);
    psVar4 = (stop_time_t *)malloc((ulong)uVar2 * 0xf0);
    *records = psVar4;
    uVar1 = 0xffffffff;
    if (psVar4 != (stop_time_t *)0x0) {
      lVar6 = 0;
      do {
        iVar3 = sqlite3_step(local_1d0);
        db->rc = iVar3;
        uVar1 = uVar2;
        if (iVar3 != 100) break;
        init_stop_time(&local_1c8);
        puVar5 = sqlite3_column_text(local_1d0,0);
        strcpy(local_1c8.trip_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_1d0,1);
        strcpy(local_1c8.arrival_time,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_1d0,2);
        strcpy(local_1c8.departure_time,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_1d0,3);
        strcpy(local_1c8.stop_id,(char *)puVar5);
        local_1c8.stop_sequence = sqlite3_column_int(local_1d0,4);
        puVar5 = sqlite3_column_text(local_1d0,5);
        strcpy(local_1c8.stop_headsign,(char *)puVar5);
        local_1c8.pickup_type = sqlite3_column_int(local_1d0,6);
        local_1c8.dropoff_type = sqlite3_column_int(local_1d0,7);
        local_1c8.shape_dist_traveled = sqlite3_column_double(local_1d0,8);
        local_1c8.timepoint = sqlite3_column_int(local_1d0,9);
        memcpy((*records)->trip_id + lVar6,&local_1c8,0xf0);
        lVar6 = lVar6 + 0xf0;
      } while ((ulong)uVar2 * 0xf0 - lVar6 != 0);
    }
    uVar2 = uVar1;
    sqlite3_finalize(local_1d0);
  }
  return uVar2;
}

Assistant:

int fetch_all_stop_times_db(feed_db_t *db, stop_time_t **records) {

    stop_time_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "stop_times");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "trip_id, arrival_time, departure_time,"
                    "stop_id, stop_sequence, stop_headsign,"
                    "pickup_type, drop_off_type,"
                    "shape_dist_traveled, timepoint "
                "FROM `stop_times`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_stop_time(&record);

        strcpy(record.trip_id, sqlite3_column_text(stmt, 0));
        strcpy(record.arrival_time, sqlite3_column_text(stmt, 1));
        strcpy(record.departure_time, sqlite3_column_text(stmt, 2));
        strcpy(record.stop_id, sqlite3_column_text(stmt, 3));
        record.stop_sequence = sqlite3_column_int(stmt, 4);
        strcpy(record.stop_headsign, sqlite3_column_text(stmt, 5));
        record.pickup_type = (stop_type_t)sqlite3_column_int(stmt, 6);
        record.dropoff_type = (stop_type_t)sqlite3_column_int(stmt, 7);
        record.shape_dist_traveled = sqlite3_column_double(stmt, 8);
        record.timepoint = (timepoint_precision_t)sqlite3_column_int(stmt, 9);

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}